

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

WatchID __thiscall
efsw::FileWatcherGeneric::addWatch
          (FileWatcherGeneric *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  bool bVar1;
  Error EVar2;
  uint uVar3;
  WatcherGeneric *this_00;
  Lock local_1c8;
  Lock lock;
  WatcherGeneric *pWatch;
  string local_198 [32];
  string local_178 [32];
  FileSystem local_158 [8];
  string link;
  string local_138 [8];
  string curPath;
  string local_118 [32];
  string local_f8 [36];
  undefined4 local_d4;
  string local_d0 [32];
  undefined1 local_b0 [8];
  FileInfo fi;
  string local_58 [8];
  string dir;
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options_local;
  bool recursive_local;
  FileWatchListener *watcher_local;
  string *directory_local;
  FileWatcherGeneric *this_local;
  
  std::__cxx11::string::string(local_58,(string *)directory);
  FileSystem::dirAddSlashAtEnd((string *)local_58);
  FileInfo::FileInfo((FileInfo *)local_b0,(string *)local_58);
  bVar1 = FileInfo::isDirectory((FileInfo *)local_b0);
  if (!bVar1) {
    std::__cxx11::string::string(local_d0,local_58);
    EVar2 = Errors::Log::createLastError(FileNotFound,(string *)local_d0);
    this_local = (FileWatcherGeneric *)(long)EVar2;
    std::__cxx11::string::~string(local_d0);
    local_d4 = 1;
    goto LAB_00108633;
  }
  bVar1 = FileInfo::isReadable((FileInfo *)local_b0);
  if (!bVar1) {
    std::__cxx11::string::string(local_f8,local_58);
    EVar2 = Errors::Log::createLastError(FileNotReadable,(string *)local_f8);
    this_local = (FileWatcherGeneric *)(long)EVar2;
    std::__cxx11::string::~string(local_f8);
    local_d4 = 1;
    goto LAB_00108633;
  }
  uVar3 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,local_58);
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::string(local_118,local_58);
    EVar2 = Errors::Log::createLastError(FileRepeated,(string *)local_118);
    this_local = (FileWatcherGeneric *)(long)EVar2;
    std::__cxx11::string::~string(local_118);
    local_d4 = 1;
    goto LAB_00108633;
  }
  std::__cxx11::string::string(local_138);
  std::__cxx11::string::string(local_178,local_58);
  FileSystem::getLinkRealPath(local_158,(string *)local_178,(string *)local_138);
  std::__cxx11::string::~string(local_178);
  bVar1 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_158);
  if (bVar1) {
    uVar3 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,local_158);
    if ((uVar3 & 1) == 0) {
      uVar3 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])(this,local_138,local_158);
      if ((uVar3 & 1) != 0) {
        std::__cxx11::string::operator=(local_58,(string *)local_158);
        goto LAB_00108515;
      }
      std::__cxx11::string::string((string *)&pWatch,local_58);
      EVar2 = Errors::Log::createLastError(FileOutOfScope,(string *)&pWatch);
      this_local = (FileWatcherGeneric *)(long)EVar2;
      std::__cxx11::string::~string((string *)&pWatch);
      local_d4 = 1;
    }
    else {
      std::__cxx11::string::string(local_198,local_58);
      EVar2 = Errors::Log::createLastError(FileRepeated,(string *)local_198);
      this_local = (FileWatcherGeneric *)(long)EVar2;
      std::__cxx11::string::~string(local_198);
      local_d4 = 1;
    }
  }
  else {
LAB_00108515:
    this->mLastWatchID = this->mLastWatchID + 1;
    this_00 = (WatcherGeneric *)operator_new(0x70);
    WatcherGeneric::WatcherGeneric
              (this_00,this->mLastWatchID,(string *)local_58,watcher,&this->super_FileWatcherImpl,
               recursive);
    lock.mMutex = (Mutex *)this_00;
    Lock::Lock(&local_1c8,&this->mWatchesLock);
    std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::push_back
              (&this->mWatches,(value_type *)&lock);
    this_local = (FileWatcherGeneric *)lock.mMutex[1].mMutexImpl;
    local_d4 = 1;
    Lock::~Lock(&local_1c8);
  }
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string(local_138);
LAB_00108633:
  FileInfo::~FileInfo((FileInfo *)local_b0);
  std::__cxx11::string::~string(local_58);
  return (WatchID)this_local;
}

Assistant:

WatchID FileWatcherGeneric::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, const std::vector<WatcherOption>& options ) {
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() ) {
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	} else if ( !fi.isReadable() ) {
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	} else if ( pathInWatches( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRepeated, dir );
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link ) {
		if ( pathInWatches( link ) ) {
			return Errors::Log::createLastError( Errors::FileRepeated, dir );
		} else if ( !linkAllowed( curPath, link ) ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		} else {
			dir = link;
		}
	}

	mLastWatchID++;

	WatcherGeneric* pWatch = new WatcherGeneric( mLastWatchID, dir, watcher, this, recursive );

	Lock lock( mWatchesLock );
	mWatches.push_back( pWatch );

	return pWatch->ID;
}